

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_escape_sequence<std::vector<char,std::allocator<char>>>
          (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  const_iterator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  bool bVar1;
  reference pcVar2;
  value_type *pvVar3;
  uint *loc_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  location<std::vector<char,_std::allocator<char>_>_> *loc_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_11;
  bool bVar4;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_940;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8d8;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_870;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_790;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_758;
  char *local_738;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_72b;
  undefined1 local_72a;
  allocator<char> local_729;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  iterator local_700;
  size_type local_6f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6f0;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6d1;
  location<std::vector<char,_std::allocator<char>_>_> *local_6d0;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_6c8;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6c0;
  undefined1 local_698 [47];
  allocator<char> local_669;
  string local_668;
  undefined1 local_648 [8];
  string msg;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_601;
  location<std::vector<char,_std::allocator<char>_>_> *local_600;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_5f8;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f0;
  undefined1 local_5c8 [47];
  allocator<char> local_599;
  string local_598;
  string local_578;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_558;
  string local_538;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_518;
  undefined1 local_4f8 [8];
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token_1;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_489;
  location<std::vector<char,_std::allocator<char>_>_> *local_488;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_480;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  undefined1 local_450 [47];
  allocator<char> local_421;
  string local_420;
  string local_400;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  undefined4 local_3bc;
  string local_3b8;
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  undefined1 local_378 [8];
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  string local_320 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_300;
  allocator<char> local_2d9;
  string local_2d8 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  allocator<char> local_291;
  string local_290 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  allocator<char> local_249;
  string local_248 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  allocator<char> local_201;
  string local_200 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  allocator<char> local_1b9;
  string local_1b8 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  allocator<char> local_171;
  string local_170 [32];
  success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_101;
  location<std::vector<char,_std::allocator<char>_>_> *local_100;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f8;
  pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_c8 [63];
  allocator<char> local_89;
  string local_88;
  string local_68;
  failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_48
  ;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  const_iterator first;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  
  first._M_current = (char *)this;
  local_20._M_current =
       (char *)location<std::vector<char,_std::allocator<char>_>_>::iter
                         ((location<std::vector<char,_std::allocator<char>_>_> *)this);
  local_28._M_current =
       (char *)location<std::vector<char,_std::allocator<char>_>_>::end(first._M_current);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_28);
  bVar4 = true;
  if (!bVar1) {
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_20);
    bVar4 = *pcVar2 != '\\';
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"[error]: toml::parse_escape_sequence: ",&local_89);
    local_f8 = &local_f0;
    local_100 = (location<std::vector<char,_std::allocator<char>_>_> *)first._M_current;
    std::
    pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[38],_true>
              (local_f8,&local_100,(char (*) [38])"the next token is not a backslash \"\\\"");
    local_c8._0_8_ = &local_f0;
    local_c8._8_8_ = 1;
    std::
    allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_101);
    __l_03._M_len = local_c8._8_8_;
    __l_03._M_array = (iterator)local_c8._0_8_;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_c8 + 0x10),__l_03,&local_101);
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_128);
    format_underline(&local_68,&local_88,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(local_c8 + 0x10),&local_128);
    err<std::__cxx11::string>(&local_48,(toml *)&local_68,v);
    result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::result(__return_storage_ptr__,&local_48);
    failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~failure(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_c8 + 0x10));
    std::
    allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_101);
    local_790 = (pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_c8;
    do {
      local_790 = local_790 + -1;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_790);
    } while (local_790 != &local_f0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  else {
    location<std::vector<char,_std::allocator<char>_>_>::advance
              ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
    local_130._M_current =
         (char *)location<std::vector<char,_std::allocator<char>_>_>::iter(first._M_current);
    pcVar2 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_130);
    loc_00 = &switchD_0013b1f4::switchdataD_0017c298;
    switch(*pcVar2) {
    case '\"':
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1b8,"\"",&local_1b9);
      ok<std::__cxx11::string>(&local_198,(toml *)local_1b8,v_01);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_198);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_198);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      break;
    default:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_668,
                 "[error] parse_escape_sequence: unknown escape sequence appeared.",&local_669);
      local_6c8 = &local_6c0;
      local_6d0 = (location<std::vector<char,_std::allocator<char>_>_> *)first._M_current;
      std::
      pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[64],_true>
                (local_6c8,&local_6d0,
                 (char (*) [64])"escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx")
      ;
      local_698._0_8_ = &local_6c0;
      local_698._8_8_ = 1;
      std::
      allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_6d1);
      __l_00._M_len = local_698._8_8_;
      __l_00._M_array = (iterator)local_698._0_8_;
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_698 + 0x10),__l_00,&local_6d1);
      local_72a = 1;
      local_728 = &local_720;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_720,
                 "if you want to write backslash as just one backslash, use literal string like: regex    = \'<\\i\\c*\\s*>\'"
                 ,&local_729);
      local_72a = 0;
      local_700 = &local_720;
      local_6f8 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_72b);
      __l._M_len = local_6f8;
      __l._M_array = local_700;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_6f0,__l,&local_72b);
      format_underline((string *)local_648,&local_668,
                       (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_698 + 0x10),&local_6f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_6f0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_72b);
      local_940 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_700;
      do {
        local_940 = local_940 + -1;
        std::__cxx11::string::~string((string *)local_940);
      } while (local_940 != &local_720);
      std::allocator<char>::~allocator(&local_729);
      std::
      vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_698 + 0x10));
      std::
      allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator(&local_6d1);
      local_958 = (pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_698;
      do {
        local_958 = local_958 + -1;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_958);
      } while (local_958 != &local_6c0);
      std::__cxx11::string::~string((string *)&local_668);
      std::allocator<char>::~allocator(&local_669);
      local_738 = local_20._M_current;
      location<std::vector<char,_std::allocator<char>_>_>::reset
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,
                 (const_iterator)local_20._M_current);
      err<std::__cxx11::string_const&>(&local_758,(toml *)local_648,v_11);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_758);
      failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~failure(&local_758);
      local_3bc = 1;
      std::__cxx11::string::~string((string *)local_648);
      break;
    case 'U':
      sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
      ::invoke<std::vector<char,std::allocator<char>>>
                ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                  *)local_4f8,
                 (sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
                  *)first._M_current,loc_01);
      bVar4 = toml::result::operator_cast_to_bool((result *)local_4f8);
      if (bVar4) {
        pvVar3 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                 ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                           *)local_4f8);
        read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                  (&local_538,(detail *)pvVar3,
                   (region<std::vector<char,_std::allocator<char>_>_> *)first._M_current,
                   (location<std::vector<char,_std::allocator<char>_>_> *)loc_00);
        ok<std::__cxx11::string>(&local_518,(toml *)&local_538,v_09);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_518);
        success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~success(&local_518);
        std::__cxx11::string::~string((string *)&local_538);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_598,
                   "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint Uxxxxxxxx"
                   ,&local_599);
        local_5f8 = &local_5f0;
        local_600 = (location<std::vector<char,_std::allocator<char>_>_> *)first._M_current;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                  (local_5f8,&local_600,(char (*) [5])0x183bfb);
        local_5c8._0_8_ = &local_5f0;
        local_5c8._8_8_ = 1;
        std::
        allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_601);
        __l_01._M_len = local_5c8._8_8_;
        __l_01._M_array = (iterator)local_5c8._0_8_;
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_5c8 + 0x10),__l_01,&local_601);
        msg.field_2._8_8_ = 0;
        this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&msg.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_01);
        format_underline(&local_578,&local_598,
                         (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_5c8 + 0x10),this_01);
        err<std::__cxx11::string>(&local_558,(toml *)&local_578,v_10);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_558);
        failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~failure(&local_558);
        std::__cxx11::string::~string((string *)&local_578);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&msg.field_2 + 8));
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_5c8 + 0x10));
        std::
        allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator(&local_601);
        local_8d8 = (pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_5c8;
        do {
          local_8d8 = local_8d8 + -1;
          std::
          pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(local_8d8);
        } while (local_8d8 != &local_5f0);
        std::__cxx11::string::~string((string *)&local_598);
        std::allocator<char>::~allocator(&local_599);
      }
      local_3bc = 1;
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::~result((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                 *)local_4f8);
      break;
    case '\\':
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_170,"\\",&local_171);
      ok<std::__cxx11::string>(&local_150,(toml *)local_170,v_00);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_150);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_150);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator(&local_171);
      break;
    case 'b':
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_200,"\b",&local_201);
      ok<std::__cxx11::string>(&local_1e0,(toml *)local_200,v_02);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_1e0);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_1e0);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator(&local_201);
      break;
    case 'f':
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2d8,"\f",&local_2d9);
      ok<std::__cxx11::string>(&local_2b8,(toml *)local_2d8,v_05);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_2b8);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_2b8);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      break;
    case 'n':
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_290,"\n",&local_291);
      ok<std::__cxx11::string>(&local_270,(toml *)local_290,v_04);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_270);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_270);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator(&local_291);
      break;
    case 'r':
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_320,"\r",
                 (allocator<char> *)((long)&token.field_1.succ.value.last_._M_current + 7));
      ok<std::__cxx11::string>(&local_300,(toml *)local_320,v_06);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_300);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_300);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&token.field_1.succ.value.last_._M_current + 7));
      break;
    case 't':
      location<std::vector<char,_std::allocator<char>_>_>::advance
                ((location<std::vector<char,_std::allocator<char>_>_> *)first._M_current,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_248,"\t",&local_249);
      ok<std::__cxx11::string>(&local_228,(toml *)local_248,v_03);
      result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::result(__return_storage_ptr__,&local_228);
      success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~success(&local_228);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator(&local_249);
      break;
    case 'u':
      sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
      ::invoke<std::vector<char,std::allocator<char>>>
                ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                  *)local_378,
                 (sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
                  *)first._M_current,loc_01);
      bVar4 = toml::result::operator_cast_to_bool((result *)local_378);
      if (bVar4) {
        pvVar3 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                 ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                           *)local_378);
        read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                  (&local_3b8,(detail *)pvVar3,
                   (region<std::vector<char,_std::allocator<char>_>_> *)first._M_current,
                   (location<std::vector<char,_std::allocator<char>_>_> *)loc_00);
        ok<std::__cxx11::string>(&local_398,(toml *)&local_3b8,v_07);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_398);
        success<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~success(&local_398);
        std::__cxx11::string::~string((string *)&local_3b8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_420,
                   "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint uXXXX.",
                   &local_421);
        local_480 = &local_478;
        local_488 = (location<std::vector<char,_std::allocator<char>_>_> *)first._M_current;
        std::
        pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                  (local_480,&local_488,(char (*) [5])0x183bfb);
        local_450._0_8_ = &local_478;
        local_450._8_8_ = 1;
        std::
        allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::allocator(&local_489);
        __l_02._M_len = local_450._8_8_;
        __l_02._M_array = (iterator)local_450._0_8_;
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_450 + 0x10),__l_02,&local_489);
        token_1.field_1.succ.value.last_._M_current = (const_iterator)(char *)0x0;
        this_00 = &token_1.field_1.succ.value.last_;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00);
        format_underline(&local_400,&local_420,
                         (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)(local_450 + 0x10),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00);
        err<std::__cxx11::string>(&local_3e0,(toml *)&local_400,v_08);
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::result(__return_storage_ptr__,&local_3e0);
        failure<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~failure(&local_3e0);
        std::__cxx11::string::~string((string *)&local_400);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&token_1.field_1.succ.value.last_);
        std::
        vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_450 + 0x10));
        std::
        allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~allocator(&local_489);
        local_870 = (pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_450;
        do {
          local_870 = local_870 + -1;
          std::
          pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(local_870);
        } while (local_870 != &local_478);
        std::__cxx11::string::~string((string *)&local_420);
        std::allocator<char>::~allocator(&local_421);
      }
      local_3bc = 1;
      result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
      ::~result((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                 *)local_378);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::string, std::string> parse_escape_sequence(location<Container>& loc)
{
    const auto first = loc.iter();
    if(first == loc.end() || *first != '\\')
    {
        return err(format_underline("[error]: toml::parse_escape_sequence: ", {{
            std::addressof(loc), "the next token is not a backslash \"\\\""}}));
    }
    loc.advance();
    switch(*loc.iter())
    {
        case '\\':{loc.advance(); return ok(std::string("\\"));}
        case '"' :{loc.advance(); return ok(std::string("\""));}
        case 'b' :{loc.advance(); return ok(std::string("\b"));}
        case 't' :{loc.advance(); return ok(std::string("\t"));}
        case 'n' :{loc.advance(); return ok(std::string("\n"));}
        case 'f' :{loc.advance(); return ok(std::string("\f"));}
        case 'r' :{loc.advance(); return ok(std::string("\r"));}
        case 'u' :
        {
            if(const auto token = lex_escape_unicode_short::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint uXXXX.",
                           {{std::addressof(loc), "here"}}));
            }
        }
        case 'U':
        {
            if(const auto token = lex_escape_unicode_long::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint Uxxxxxxxx",
                           {{std::addressof(loc), "here"}}));
            }
        }
    }

    const auto msg = format_underline("[error] parse_escape_sequence: "
           "unknown escape sequence appeared.", {{std::addressof(loc),
           "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx"}},
           /* Hints = */{"if you want to write backslash as just one backslash, "
           "use literal string like: regex    = '<\\i\\c*\\s*>'"});
    loc.reset(first);
    return err(msg);
}